

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_tableinout_function.cpp
# Opt level: O3

OperatorFinalizeResultType __thiscall
duckdb::PhysicalTableInOutFunction::FinalExecute
          (PhysicalTableInOutFunction *this,ExecutionContext *context,DataChunk *chunk,
          GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  OperatorFinalizeResultType OVar1;
  InternalException *this_00;
  TableFunctionInput data;
  string local_40;
  
  if ((this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_40._M_dataplus._M_p =
         (pointer)(this->bind_data).
                  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                  .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    local_40._M_string_length = (size_type)state_p[1]._vptr_OperatorState;
    local_40.field_2._M_allocated_capacity = (size_type)gstate_p[1]._vptr_GlobalOperatorState;
    OVar1 = (*(this->function).in_out_function_final)(context,(TableFunctionInput *)&local_40,chunk)
    ;
    return OVar1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"FinalExecute not supported for project_input","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

OperatorFinalizeResultType PhysicalTableInOutFunction::FinalExecute(ExecutionContext &context, DataChunk &chunk,
                                                                    GlobalOperatorState &gstate_p,
                                                                    OperatorState &state_p) const {
	auto &gstate = gstate_p.Cast<TableInOutGlobalState>();
	auto &state = state_p.Cast<TableInOutLocalState>();
	if (!projected_input.empty()) {
		throw InternalException("FinalExecute not supported for project_input");
	}
	TableFunctionInput data(bind_data.get(), state.local_state.get(), gstate.global_state.get());
	return function.in_out_function_final(context, data, chunk);
}